

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O2

int Dsd_TreeCountNonTerminalNodes(Dsd_Manager_t *pDsdMan)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < pDsdMan->nRoots; lVar3 = lVar3 + 1) {
    iVar1 = Dsd_TreeCountNonTerminalNodes_rec
                      ((Dsd_Node_t *)((ulong)pDsdMan->pRoots[lVar3] & 0xfffffffffffffffe));
    iVar2 = iVar2 + iVar1;
  }
  Dsd_TreeUnmark(pDsdMan);
  return iVar2;
}

Assistant:

int Dsd_TreeCountNonTerminalNodes( Dsd_Manager_t * pDsdMan )
{
    int Counter, i;
    Counter = 0;
    for ( i = 0; i < pDsdMan->nRoots; i++ )
        Counter += Dsd_TreeCountNonTerminalNodes_rec( Dsd_Regular( pDsdMan->pRoots[i] ) );
    Dsd_TreeUnmark( pDsdMan );
    return Counter;
}